

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall punky::lex::Lexer::next_token(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  bool bVar2;
  TokenType type_00;
  char *pcVar3;
  TokenLiteral local_7b8;
  Token local_790;
  string local_760;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_740;
  byte local_712;
  TokenLiteral local_710;
  byte local_6e1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6e0;
  TokenType local_6b4;
  undefined1 local_6b0 [4];
  TokenType type;
  string ident;
  TokenLiteral local_688;
  TokenLiteral local_658;
  Token local_630;
  TokenLiteral local_5f8;
  Token local_5d0;
  TokenLiteral local_598;
  Token local_570;
  TokenLiteral local_538;
  Token local_510;
  TokenLiteral local_4d8;
  Token local_4b0;
  TokenLiteral local_478;
  Token local_450;
  TokenLiteral local_418;
  Token local_3f0;
  TokenLiteral local_3b8;
  Token local_390;
  TokenLiteral local_358;
  Token local_330;
  TokenLiteral local_2f8;
  Token local_2d0;
  TokenLiteral local_298;
  Token local_270;
  TokenLiteral local_238;
  Token local_210;
  TokenLiteral local_1d8;
  Token local_1b0;
  TokenLiteral local_178;
  Token local_150;
  _Optional_payload_base<char> local_11d;
  _Optional_payload_base<char> local_11b;
  TokenLiteral local_118;
  Token local_f0;
  TokenLiteral local_b8;
  Token local_90;
  _Optional_payload_base<char> local_5e [10];
  _Optional_payload_base<char> local_4a;
  undefined1 local_48 [8];
  Token tok;
  Lexer *this_local;
  
  tok.m_literal.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = this;
  skip_whitespace(this);
  local_48._0_4_ = LeftParen;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&tok);
  switch(this->m_curr_char) {
  case '\0':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(__return_storage_ptr__,EOS,&local_688);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_688);
    ident.field_2._8_4_ = 1;
    goto LAB_0010d82c;
  default:
    bVar2 = utils::is_letter(this->m_curr_char);
    if (bVar2) {
      tokenize_identifier_abi_cxx11_((string *)local_6b0,this);
      type_00 = token_type((string *)local_6b0);
      local_6e1 = 0;
      local_712 = 0;
      local_6b4 = type_00;
      if (type_00 == Identifier) {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_6e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b0);
        local_6e1 = 1;
        punky::tok::make_token(__return_storage_ptr__,Identifier,&local_6e0);
      }
      else {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional();
        local_712 = 1;
        punky::tok::make_token(__return_storage_ptr__,type_00,&local_710);
      }
      if ((local_712 & 1) != 0) {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_710);
      }
      if ((local_6e1 & 1) != 0) {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_6e0);
      }
      ident.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_6b0);
      goto LAB_0010d82c;
    }
    bVar2 = utils::is_digit(this->m_curr_char);
    if (bVar2) {
      tokenize_integer_abi_cxx11_(&local_760,this);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_740,&local_760);
      punky::tok::make_token(__return_storage_ptr__,Int,&local_740);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_740);
      std::__cxx11::string::~string((string *)&local_760);
      ident.field_2._8_4_ = 1;
      goto LAB_0010d82c;
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_790,Illegal,&local_7b8);
    punky::tok::Token::operator=((Token *)local_48,&local_790);
    punky::tok::Token::~Token(&local_790);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_7b8);
    break;
  case '!':
    local_11b = (_Optional_payload_base<char>)peek(this);
    bVar1 = std::optional<char>::has_value((optional<char> *)&local_11b);
    bVar2 = false;
    if (bVar1) {
      local_11d = (_Optional_payload_base<char>)peek(this);
      pcVar3 = std::optional<char>::value((optional<char> *)&local_11d);
      bVar2 = *pcVar3 == '=';
    }
    if (bVar2) {
      consume(this);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      punky::tok::make_token(&local_150,BangEqual,&local_178);
      punky::tok::Token::operator=((Token *)local_48,&local_150);
      punky::tok::Token::~Token(&local_150);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_178);
    }
    else {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      punky::tok::make_token(&local_1b0,Bang,&local_1d8);
      punky::tok::Token::operator=((Token *)local_48,&local_1b0);
      punky::tok::Token::~Token(&local_1b0);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_1d8);
    }
    break;
  case '(':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_4b0,LeftParen,&local_4d8);
    punky::tok::Token::operator=((Token *)local_48,&local_4b0);
    punky::tok::Token::~Token(&local_4b0);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_4d8);
    break;
  case ')':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_510,RightParen,&local_538);
    punky::tok::Token::operator=((Token *)local_48,&local_510);
    punky::tok::Token::~Token(&local_510);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_538);
    break;
  case '*':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_330,Asterisk,&local_358);
    punky::tok::Token::operator=((Token *)local_48,&local_330);
    punky::tok::Token::~Token(&local_330);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_358);
    break;
  case '+':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_210,Plus,&local_238);
    punky::tok::Token::operator=((Token *)local_48,&local_210);
    punky::tok::Token::~Token(&local_210);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_238);
    break;
  case ',':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_570,Comma,&local_598);
    punky::tok::Token::operator=((Token *)local_48,&local_570);
    punky::tok::Token::~Token(&local_570);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_598);
    break;
  case '-':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_270,Minus,&local_298);
    punky::tok::Token::operator=((Token *)local_48,&local_270);
    punky::tok::Token::~Token(&local_270);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_298);
    break;
  case '/':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_2d0,Slash,&local_2f8);
    punky::tok::Token::operator=((Token *)local_48,&local_2d0);
    punky::tok::Token::~Token(&local_2d0);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_2f8);
    break;
  case ';':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_450,Semicolon,&local_478);
    punky::tok::Token::operator=((Token *)local_48,&local_450);
    punky::tok::Token::~Token(&local_450);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_478);
    break;
  case '<':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_390,Less,&local_3b8);
    punky::tok::Token::operator=((Token *)local_48,&local_390);
    punky::tok::Token::~Token(&local_390);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_3b8);
    break;
  case '=':
    local_4a = (_Optional_payload_base<char>)peek(this);
    bVar1 = std::optional<char>::has_value((optional<char> *)&local_4a);
    bVar2 = false;
    if (bVar1) {
      local_5e[0] = (_Optional_payload_base<char>)peek(this);
      pcVar3 = std::optional<char>::value((optional<char> *)local_5e);
      bVar2 = *pcVar3 == '=';
    }
    if (bVar2) {
      consume(this);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      punky::tok::make_token(&local_90,EqualEqual,&local_b8);
      punky::tok::Token::operator=((Token *)local_48,&local_90);
      punky::tok::Token::~Token(&local_90);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_b8);
    }
    else {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      punky::tok::make_token(&local_f0,Equal,&local_118);
      punky::tok::Token::operator=((Token *)local_48,&local_f0);
      punky::tok::Token::~Token(&local_f0);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_118);
    }
    break;
  case '>':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_3f0,Greater,&local_418);
    punky::tok::Token::operator=((Token *)local_48,&local_3f0);
    punky::tok::Token::~Token(&local_3f0);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_418);
    break;
  case '{':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_5d0,LeftBrace,&local_5f8);
    punky::tok::Token::operator=((Token *)local_48,&local_5d0);
    punky::tok::Token::~Token(&local_5d0);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_5f8);
    break;
  case '}':
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    punky::tok::make_token(&local_630,RightBrace,&local_658);
    punky::tok::Token::operator=((Token *)local_48,&local_630);
    punky::tok::Token::~Token(&local_630);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_658);
  }
  consume(this);
  punky::tok::Token::Token(__return_storage_ptr__,(Token *)local_48);
  ident.field_2._8_4_ = 1;
LAB_0010d82c:
  punky::tok::Token::~Token((Token *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::next_token()
{
    skip_whitespace();

    auto tok = Token{};
    switch (m_curr_char)
    {
        case '=':
            if (peek().has_value() && peek().value() == '=')
            {
                consume();
                tok = make_token(TokenType::EqualEqual, std::nullopt);
            }
            else
                tok = make_token(TokenType::Equal, std::nullopt);
            break;
        case '!':
            if (peek().has_value() && peek().value() == '=')
            {
                consume();
                tok = make_token(TokenType::BangEqual, std::nullopt);
            }
            else
                tok = make_token(TokenType::Bang, std::nullopt);
            break;
        // clang-format off
        case '+': tok = make_token(TokenType::Plus, std::nullopt); break;
        case '-': tok = make_token(TokenType::Minus, std::nullopt); break;
        case '/': tok = make_token(TokenType::Slash, std::nullopt); break;
        case '*': tok = make_token(TokenType::Asterisk, std::nullopt); break;
        case '<': tok = make_token(TokenType::Less, std::nullopt); break;
        case '>': tok = make_token(TokenType::Greater, std::nullopt); break;
        case ';': tok = make_token(TokenType::Semicolon, std::nullopt); break;
        case '(': tok = make_token(TokenType::LeftParen, std::nullopt); break;
        case ')': tok = make_token(TokenType::RightParen, std::nullopt); break;
        case ',': tok = make_token(TokenType::Comma, std::nullopt); break;
        case '{': tok = make_token(TokenType::LeftBrace, std::nullopt); break;
        case '}': tok = make_token(TokenType::RightBrace, std::nullopt); break;
        case  0 : return make_token(TokenType::EOS, std::nullopt);
        // clang-format on
        default:
            if (utils::is_letter(m_curr_char))
            {
                auto       ident = tokenize_identifier();
                const auto type  = token_type(ident);
                return type == TokenType::Identifier ? make_token(type, std::move(ident))
                                                     : make_token(type, std::nullopt);
            }
            else if (utils::is_digit(m_curr_char))
                return make_token(TokenType::Int, tokenize_integer());
            else
                tok = make_token(TokenType::Illegal, std::nullopt);
            break;
    }

    consume();
    return tok;
}